

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O0

void __thiscall capnp::anon_unknown_79::Input::consume(Input *this,ArrayPtr<const_char> expected)

{
  bool bVar1;
  size_t sVar2;
  size_t sVar3;
  Fault local_50;
  Fault f_1;
  ArrayPtr<const_char> prefix;
  Fault local_28;
  Fault f;
  Input *this_local;
  ArrayPtr<const_char> expected_local;
  
  expected_local.ptr = (char *)expected.size_;
  this_local = (Input *)expected.ptr;
  f.exception = (Exception *)this;
  sVar2 = kj::ArrayPtr<const_char>::size(&this->wrapped);
  sVar3 = kj::ArrayPtr<const_char>::size((ArrayPtr<const_char> *)&this_local);
  if (sVar2 < sVar3) {
    kj::_::Debug::Fault::Fault
              (&local_28,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compat/json.c++"
               ,0x238,FAILED,"wrapped.size() >= expected.size()","");
    kj::_::Debug::Fault::fatal(&local_28);
  }
  sVar2 = kj::ArrayPtr<const_char>::size((ArrayPtr<const_char> *)&this_local);
  _f_1 = kj::ArrayPtr<const_char>::slice(&this->wrapped,0,sVar2);
  bVar1 = kj::ArrayPtr<const_char>::operator==
                    ((ArrayPtr<const_char> *)&f_1,(ArrayPtr<const_char> *)&this_local);
  if (!bVar1) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[34]>
              (&local_50,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compat/json.c++"
               ,0x23b,FAILED,"prefix == expected","\"Unexpected input in JSON message.\"",
               (char (*) [34])"Unexpected input in JSON message.");
    kj::_::Debug::Fault::fatal(&local_50);
  }
  sVar2 = kj::ArrayPtr<const_char>::size((ArrayPtr<const_char> *)&this_local);
  advance(this,sVar2);
  return;
}

Assistant:

void consume(kj::ArrayPtr<const char> expected) {
    KJ_REQUIRE(wrapped.size() >= expected.size());

    auto prefix = wrapped.slice(0, expected.size());
    KJ_REQUIRE(prefix == expected, "Unexpected input in JSON message.");

    advance(expected.size());
  }